

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O3

CborError cbor_encode_negative_int(CborEncoder *encoder,uint64_t absolute_value)

{
  uint8_t *puVar1;
  ulong uVar2;
  CborError CVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  void *__src;
  uint8_t *puVar7;
  uint8_t *__n;
  undefined8 local_20;
  uint8_t auStack_18 [8];
  
  encoder->added = encoder->added + 1;
  __src = (void *)((long)&local_20 + 7);
  uVar2 = absolute_value >> 0x38 | (absolute_value & 0xff000000000000) >> 0x28 |
          (absolute_value & 0xff0000000000) >> 0x18 | (absolute_value & 0xff00000000) >> 8 |
          (absolute_value & 0xff000000) << 8 | (absolute_value & 0xff0000) << 0x18 |
          (absolute_value & 0xff00) << 0x28;
  local_20 = uVar2 | absolute_value << 0x38;
  if (absolute_value < 0x18) {
    local_20._0_7_ = (undefined7)uVar2;
    local_20 = CONCAT17((char)absolute_value,(undefined7)local_20) | 0x2000000000000000;
  }
  else {
    cVar5 = '\x02';
    if (absolute_value < 0x10000) {
      cVar5 = 0xff < absolute_value;
    }
    bVar6 = (cVar5 + '\x01') - (absolute_value >> 0x20 == 0);
    lVar4 = -1L << (bVar6 & 0x3f);
    __src = (void *)((long)__src + lVar4);
    auStack_18[lVar4 + -1] = bVar6 | 0x38;
  }
  __n = auStack_18 + -(long)__src;
  puVar1 = encoder->end;
  if (puVar1 == (uint8_t *)0x0) {
    puVar7 = (encoder->data).ptr;
    if ((long)(puVar7 + (long)(__n + -1)) < 0) goto LAB_001027f6;
  }
  else {
    puVar7 = (encoder->data).ptr;
    if (-1 < (long)puVar1 - (long)(__n + (long)puVar7)) {
LAB_001027f6:
      memcpy(puVar7,__src,(size_t)__n);
      puVar7 = __n + (long)(encoder->data).ptr;
      CVar3 = CborNoError;
      goto LAB_00102806;
    }
    __n = puVar7 + ((long)__n - (long)puVar1);
    encoder->end = (uint8_t *)0x0;
    puVar7 = (uint8_t *)0x0;
  }
  puVar7 = puVar7 + (long)__n;
  CVar3 = CborErrorOutOfMemory;
LAB_00102806:
  (encoder->data).ptr = puVar7;
  return CVar3;
}

Assistant:

CborError cbor_encode_negative_int(CborEncoder *encoder, uint64_t absolute_value)
{
    return encode_number(encoder, absolute_value, NegativeIntegerType << MajorTypeShift);
}